

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O1

void __thiscall wasm::ReFinalize::updateBreakValueType(ReFinalize *this,Name name,Type type)

{
  __hashtable *__h;
  _Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var1;
  __node_gen_type __node_gen;
  Name name_local;
  Type type_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  __node_gen._M_h = name.super_IString.str._M_len;
  if (type.id != 1) {
    name_local.super_IString.str._M_str = (char *)type.id;
    p_Var1 = (_Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->breakTypes,(key_type *)&__node_gen);
    std::
    _Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<wasm::Type_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Type,true>>>>
              (p_Var1,&name_local.super_IString.str._M_str);
  }
  return;
}

Assistant:

void ReFinalize::updateBreakValueType(Name name, Type type) {
  if (type != Type::unreachable) {
    breakTypes[name].insert(type);
  }
}